

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall QTabWidget::changeEvent(QTabWidget *this,QEvent *ev)

{
  Type TVar1;
  QEvent *in_RSI;
  QEvent *in_RDI;
  QWidget *unaff_retaddr;
  
  TVar1 = QEvent::type(in_RSI);
  if (TVar1 == StyleChange) {
    setUpLayout((QTabWidget *)in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  }
  QWidget::changeEvent(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void QTabWidget::changeEvent(QEvent *ev)
{
    if (ev->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || ev->type() == QEvent::MacSizeChange
#endif
            )
        setUpLayout();
    QWidget::changeEvent(ev);
}